

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall amrex::AmrLevel::writePlotFile(AmrLevel *this,string *dir,ostream *os,How how)

{
  pointer pSVar1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  IndexType IVar7;
  int iVar8;
  TimeCenter TVar9;
  StateDescriptor *pSVar10;
  string *psVar11;
  _List_node_base *p_Var12;
  IndexSpace *pIVar13;
  ostream *poVar14;
  DeriveRec *pDVar15;
  size_t sVar16;
  element_type *peVar17;
  MultiFab *src;
  _List_node_base *p_Var18;
  uint uVar19;
  int k;
  long lVar20;
  long lVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dname;
  ulong uVar22;
  pointer pbVar23;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> plot_var_map;
  string FullPath;
  string sLevel;
  string TheFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  derive_names;
  MultiFab plotMF;
  char buf [64];
  int local_2c4;
  void *local_2b8;
  iterator iStack_2b0;
  pair<int,_int> *local_2a8;
  string *local_2a0;
  Real local_298;
  string local_290;
  How local_26c;
  long *local_268;
  long local_260;
  long local_258 [2];
  undefined1 local_248 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  double adStack_1e0 [45];
  char local_78 [72];
  
  local_2b8 = (void *)0x0;
  iStack_2b0._M_current = (pair<int,_int> *)0x0;
  local_2a8 = (pair<int,_int> *)0x0;
  local_2a0 = dir;
  local_26c = how;
  iVar5 = DescriptorList::size((DescriptorList *)desc_lst);
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      pSVar10 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar5);
      iVar6 = StateDescriptor::nComp(pSVar10);
      if (0 < iVar6) {
        iVar6 = 0;
        do {
          pSVar10 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar5);
          psVar11 = StateDescriptor::name_abi_cxx11_(pSVar10,iVar6);
          bVar4 = Amr::isStatePlotVar(psVar11);
          if (bVar4) {
            pSVar10 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar5);
            IVar7 = StateDescriptor::getType(pSVar10);
            if (IVar7.itype == 0) {
              local_1f8._4_4_ = iVar6;
              local_1f8._0_4_ = iVar5;
              if (iStack_2b0._M_current == local_2a8) {
                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                _M_realloc_insert<std::pair<int,int>>
                          ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                           &local_2b8,iStack_2b0,(pair<int,_int> *)local_1f8);
              }
              else {
                (iStack_2b0._M_current)->first = iVar5;
                (iStack_2b0._M_current)->second = iVar6;
                iStack_2b0._M_current = iStack_2b0._M_current + 1;
              }
            }
          }
          iVar6 = iVar6 + 1;
          pSVar10 = DescriptorList::operator[]((DescriptorList *)desc_lst,iVar5);
          iVar8 = StateDescriptor::nComp(pSVar10);
        } while (iVar6 < iVar8);
      }
      iVar5 = iVar5 + 1;
      iVar6 = DescriptorList::size((DescriptorList *)desc_lst);
    } while (iVar5 < iVar6);
  }
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var12 = (_List_node_base *)DeriveList::dlist_abi_cxx11_((DeriveList *)&derive_lst);
  p_Var18 = p_Var12->_M_next;
  if (p_Var18 == p_Var12) {
    local_2c4 = 0;
  }
  else {
    local_2c4 = 0;
    do {
      pDVar15 = (DeriveRec *)(p_Var18 + 1);
      psVar11 = DeriveRec::name_abi_cxx11_(pDVar15);
      bVar4 = Amr::isDerivePlotVar(psVar11);
      if (bVar4) {
        psVar11 = DeriveRec::name_abi_cxx11_(pDVar15);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_218,psVar11);
        iVar5 = DeriveRec::numDerive(pDVar15);
        local_2c4 = local_2c4 + iVar5;
      }
      p_Var18 = (((_List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                 &p_Var18->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var18 != p_Var12);
  }
  uVar22 = (long)iStack_2b0._M_current - (long)local_2b8;
  pIVar13 = EB2::TopIndexSpaceIfPresent();
  pSVar1 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar9 = StateDescriptor::timeType(pSVar1->desc);
  if (TVar9 == Point) {
    local_298 = (pSVar1->new_time).stop;
  }
  else {
    local_298 = ((pSVar1->new_time).start + (pSVar1->new_time).stop) * 0.5;
  }
  iVar5 = ((local_2c4 + 1) - (uint)(pIVar13 == (IndexSpace *)0x0)) + (int)(uVar22 >> 3);
  if ((this->level == 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    (*this->_vptr_AmrLevel[3])(local_1f8,this);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,(char *)local_1f8._0_8_,local_1f8._8_8_);
    local_78[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_78,1);
    if ((undefined1 *)local_1f8._0_8_ != local_1e8) {
      operator_delete((void *)local_1f8._0_8_,(long)local_1e8 + 1);
    }
    if (iVar5 == 0) {
      Error_host("Must specify at least one valid data item to plot");
    }
    poVar14 = (ostream *)std::ostream::operator<<(os,iVar5);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
    if (0 < (int)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >> 3)) {
      lVar20 = 0;
      do {
        iVar6 = *(int *)((long)local_2b8 + lVar20 * 8 + 4);
        pSVar10 = DescriptorList::operator[]
                            ((DescriptorList *)desc_lst,*(int *)((long)local_2b8 + lVar20 * 8));
        psVar11 = StateDescriptor::name_abi_cxx11_(pSVar10,iVar6);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (os,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        local_1f8[0] = (string)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
        lVar20 = lVar20 + 1;
      } while (lVar20 < (int)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >> 3));
    }
    pbVar3 = local_218.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar23 = local_218.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pDVar15 = DeriveList::get((DeriveList *)&derive_lst,pbVar23);
        iVar6 = DeriveRec::numDerive(pDVar15);
        if (0 < iVar6) {
          iVar6 = 0;
          do {
            psVar11 = DeriveRec::variableName_abi_cxx11_(pDVar15,iVar6);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (os,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
            local_1f8[0] = (string)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
            iVar6 = iVar6 + 1;
            iVar8 = DeriveRec::numDerive(pDVar15);
          } while (iVar6 < iVar8);
        }
        pbVar23 = pbVar23 + 1;
      } while (pbVar23 != pbVar3);
    }
    pIVar13 = EB2::TopIndexSpaceIfPresent();
    if (pIVar13 != (IndexSpace *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"vfrac\n",6);
    }
    poVar14 = (ostream *)std::ostream::operator<<(os,3);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
    poVar14 = std::ostream::_M_insert<double>(this->parent->cumtime);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
    uVar19 = *(uint *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    poVar14 = (ostream *)std::ostream::operator<<(os,uVar19);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
    lVar20 = 0;
    do {
      poVar14 = std::ostream::_M_insert<double>((this->geom).prob_domain.xlo[lVar20]);
      local_1f8[0] = (string)0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    lVar20 = 0;
    do {
      poVar14 = std::ostream::_M_insert<double>((this->geom).prob_domain.xhi[lVar20]);
      local_1f8[0] = (string)0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    if (0 < (int)uVar19) {
      lVar20 = 0;
      do {
        poVar14 = (ostream *)
                  std::ostream::operator<<
                            (os,*(int *)((long)((this->parent->super_AmrCore).super_AmrMesh.
                                                super_AmrInfo.ref_ratio.
                                                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                .
                                                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->vect +
                                        lVar20));
        local_1f8[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
        lVar20 = lVar20 + 0xc;
      } while ((ulong)uVar19 * 0xc != lVar20);
    }
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    if (-1 < (int)uVar19) {
      lVar20 = 0;
      do {
        poVar14 = amrex::operator<<(os,(Box *)((long)(((this->parent->super_AmrCore).super_AmrMesh.
                                                       geom.
                                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  .
                                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->domain
                                                  ).smallend.vect + lVar20));
        local_1f8[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
        lVar20 = lVar20 + 200;
      } while ((ulong)uVar19 * 200 + 200 != lVar20);
    }
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    if (-1 < (int)uVar19) {
      uVar22 = 0;
      do {
        poVar14 = (ostream *)
                  std::ostream::operator<<
                            (os,(this->parent->level_steps).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar22]);
        local_1f8[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
        uVar22 = uVar22 + 1;
      } while (uVar19 + 1 != uVar22);
    }
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
    if (-1 < (int)uVar19) {
      lVar20 = 0x20;
      uVar22 = 0;
      do {
        lVar21 = 0;
        do {
          poVar14 = std::ostream::_M_insert<double>
                              (*(double *)
                                ((long)(((this->parent->super_AmrCore).super_AmrMesh.geom.
                                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                         .
                                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys)
                                       .offset + lVar21 * 8 + lVar20 + -8));
          local_1f8[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        local_1f8[0] = (string)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(os,local_1f8,1);
        uVar22 = uVar22 + 1;
        lVar20 = lVar20 + 200;
      } while (uVar22 != uVar19 + 1);
    }
    poVar14 = (ostream *)std::ostream::operator<<(os,(this->geom).super_CoordSys.c_sys);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
    std::__ostream_insert<char,std::char_traits<char>>(os,"0\n",2);
  }
  if ((writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
       BaseName_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                                   ::BaseName_abi_cxx11_), iVar6 != 0)) {
    writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::BaseName_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                   BaseName_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                BaseName_abi_cxx11_,"/Cell","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                  BaseName_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                         ::BaseName_abi_cxx11_);
  }
  sprintf(local_78,"Level_%d",(ulong)(uint)this->level);
  local_268 = local_258;
  sVar16 = strlen(local_78);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,local_78,local_78 + sVar16);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  pcVar2 = (local_2a0->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,pcVar2,pcVar2 + local_2a0->_M_string_length);
  if ((local_290._M_string_length != 0) &&
     (local_290._M_dataplus._M_p[local_290._M_string_length - 1] != '/')) {
    std::__cxx11::string::push_back((char)&local_290);
  }
  std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_268);
  if (this->levelDirectoryCreated == false) {
    if ((*(int *)(ParallelContext::frames + 0xc) == 0) &&
       (bVar4 = UtilCreateDirectory(&local_290,0x1ed,false), !bVar4)) {
      CreateDirectoryFailed(&local_290);
    }
    ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  }
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    poVar14 = (ostream *)std::ostream::operator<<(os,this->level);
    local_1f8[0] = (string)0x20;
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
    poVar14 = std::ostream::_M_insert<long>((long)poVar14);
    local_1f8[0] = (string)0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
    poVar14 = std::ostream::_M_insert<double>(local_298);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
    poVar14 = (ostream *)
              std::ostream::operator<<
                        (os,(this->parent->level_steps).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[this->level]);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_1f8,1);
    peVar17 = (this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (0 < (long)(peVar17->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            *(long *)&(peVar17->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data) {
      local_2a0 = (string *)(this->geom).super_CoordSys.dx;
      lVar20 = 0;
      do {
        BATransformer::operator()
                  ((Box *)local_248,&(this->grids).m_bat,
                   (Box *)(lVar20 * 0x1c +
                          *(long *)&(peVar17->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        RealBox::RealBox((RealBox *)local_1f8,(Box *)local_248,(Real *)local_2a0,
                         (this->geom).prob_domain.xlo);
        lVar21 = 0;
        do {
          poVar14 = std::ostream::_M_insert<double>(*(double *)(local_1f8 + lVar21 * 8));
          local_248[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_248,1);
          poVar14 = std::ostream::_M_insert<double>(adStack_1e0[lVar21]);
          local_248[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_248,1);
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        peVar17 = (this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        lVar20 = lVar20 + 1;
        lVar21 = ((long)(peVar17->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  *(long *)&(peVar17->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7;
      } while (lVar21 - lVar20 != 0 && lVar20 <= lVar21);
    }
    if (0 < iVar5) {
      local_1f8._0_8_ = local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,local_268,local_260 + (long)local_268);
      std::__cxx11::string::_M_append
                (local_1f8,
                 (ulong)writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                        BaseName_abi_cxx11_._M_dataplus._M_p);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (os,(char *)local_1f8._0_8_,local_1f8._8_8_);
      local_248[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_248,1);
      if ((undefined1 *)local_1f8._0_8_ != local_1e8) {
        operator_delete((void *)local_1f8._0_8_,(long)local_1e8 + 1);
      }
    }
    pIVar13 = EB2::TopIndexSpaceIfPresent();
    if (((pIVar13 != (IndexSpace *)0x0) &&
        (this->level ==
         *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c)) &&
       (-1 < *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c)) {
      iVar6 = -1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,"1.0e-6\n",7);
        iVar6 = iVar6 + 1;
      } while (iVar6 < *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c
              );
    }
  }
  local_248._0_8_ = (pointer)0x1;
  local_248._8_8_ = (Arena *)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar22 = 0;
  MultiFab::MultiFab((MultiFab *)local_1f8,&this->grids,&this->dmap,iVar5,0,(MFInfo *)local_248,
                     (this->m_factory)._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  if (0 < (int)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >> 3)) {
    uVar22 = 0;
    do {
      MultiFab::Copy((MultiFab *)local_1f8,
                     (MultiFab *)
                     (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                     .super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)local_2b8 + uVar22 * 8)].new_data._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                     *(int *)((long)local_2b8 + uVar22 * 8 + 4),(int)uVar22,1,0);
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)(int)((ulong)((long)iStack_2b0._M_current - (long)local_2b8) >> 3)
            );
  }
  pbVar3 = local_218.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar19 = (uint)uVar22;
  if (local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pbVar23 = local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      (*this->_vptr_AmrLevel[0x20])(local_298,this,pbVar23,local_1f8,uVar22 & 0xffffffff);
      pDVar15 = DeriveList::get((DeriveList *)&derive_lst,pbVar23);
      iVar5 = DeriveRec::numDerive(pDVar15);
      uVar19 = (int)uVar22 + iVar5;
      uVar22 = (ulong)uVar19;
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 != pbVar3);
  }
  pIVar13 = EB2::TopIndexSpaceIfPresent();
  if (pIVar13 != (IndexSpace *)0x0) {
    local_248._0_8_ = (pointer)0x0;
    local_248._8_8_ = local_248._8_8_ & 0xffffffff00000000;
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)local_1f8,0.0,uVar19,1,(IntVect *)local_248);
    src = EBDataCollection::getVolFrac
                    ((EBDataCollection *)
                     (this->m_factory)._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl[0x1b]._vptr_FabFactory);
    MultiFab::Copy((MultiFab *)local_1f8,src,0,uVar19,1,0);
  }
  local_248._0_8_ = &local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,local_290._M_dataplus._M_p,
             local_290._M_dataplus._M_p + local_290._M_string_length);
  std::__cxx11::string::_M_append
            (local_248,
             (ulong)writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                    BaseName_abi_cxx11_._M_dataplus._M_p);
  bVar4 = AsyncOut::UseAsyncOut();
  if (bVar4) {
    VisMF::AsyncWrite((FabArray<amrex::FArrayBox> *)local_1f8,(string *)local_248,false);
  }
  else {
    VisMF::Write((FabArray<amrex::FArrayBox> *)local_1f8,(string *)local_248,local_26c,true);
  }
  this->levelDirectoryCreated = false;
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)local_248._0_8_ != &local_238) {
    operator_delete((void *)local_248._0_8_,
                    (ulong)((long)local_238.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  MultiFab::~MultiFab((MultiFab *)local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  if (local_2b8 != (void *)0x0) {
    operator_delete(local_2b8,(long)local_2a8 - (long)local_2b8);
  }
  return;
}

Assistant:

void
AmrLevel::writePlotFile (const std::string& dir,
                         std::ostream&      os,
                         VisMF::How         how)
{
    int i, n;
    //
    // The list of indices of State to write to plotfile.
    // first component of pair is state_type,
    // second component of pair is component # within the state_type
    //
    std::vector<std::pair<int,int> > plot_var_map;
    for (int typ = 0; typ < desc_lst.size(); typ++)
    {
        for (int comp = 0; comp < desc_lst[typ].nComp();comp++)
        {
            if (parent->isStatePlotVar(desc_lst[typ].name(comp)) &&
                desc_lst[typ].getType() == IndexType::TheCellType())
            {
                plot_var_map.push_back(std::pair<int,int>(typ,comp));
            }
        }
    }

    int num_derive = 0;
    std::vector<std::string> derive_names;
    const std::list<DeriveRec>& dlist = derive_lst.dlist();
    for (auto const& d : dlist)
    {
        if (parent->isDerivePlotVar(d.name()))
        {
            derive_names.push_back(d.name());
            num_derive += d.numDerive();
        }
    }

    int n_data_items = plot_var_map.size() + num_derive;

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        n_data_items += 1;
    }
#endif

    // get the time from the first State_Type
    // if the State_Type is ::Interval, this will get t^{n+1/2} instead of t^n
    Real cur_time = state[0].curTime();

    if (level == 0 && ParallelDescriptor::IOProcessor())
    {
        //
        // The first thing we write out is the plotfile type.
        //
        os << thePlotFileType() << '\n';

        if (n_data_items == 0)
            amrex::Error("Must specify at least one valid data item to plot");

        os << n_data_items << '\n';

        //
        // Names of variables
        //
        for (i =0; i < static_cast<int>(plot_var_map.size()); i++)
        {
            int typ = plot_var_map[i].first;
            int comp = plot_var_map[i].second;
            os << desc_lst[typ].name(comp) << '\n';
        }

        // derived
        for (auto const& dname : derive_names) {
            const DeriveRec* rec = derive_lst.get(dname);
            for (i = 0; i < rec->numDerive(); ++i) {
                os << rec->variableName(i) << '\n';
            }
        }

#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            os << "vfrac\n";
        }
#endif

        os << AMREX_SPACEDIM << '\n';
        os << parent->cumTime() << '\n';
        int f_lev = parent->finestLevel();
        os << f_lev << '\n';
        for (i = 0; i < AMREX_SPACEDIM; i++)
            os << Geom().ProbLo(i) << ' ';
        os << '\n';
        for (i = 0; i < AMREX_SPACEDIM; i++)
            os << Geom().ProbHi(i) << ' ';
        os << '\n';
        for (i = 0; i < f_lev; i++)
            os << parent->refRatio(i)[0] << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
            os << parent->Geom(i).Domain() << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
            os << parent->levelSteps(i) << ' ';
        os << '\n';
        for (i = 0; i <= f_lev; i++)
        {
            for (int k = 0; k < AMREX_SPACEDIM; k++)
                os << parent->Geom(i).CellSize()[k] << ' ';
            os << '\n';
        }
        os << (int) Geom().Coord() << '\n';
        os << "0\n"; // Write bndry data.

    }
    // Build the directory to hold the MultiFab at this level.
    // The name is relative to the directory containing the Header file.
    //
    static const std::string BaseName = "/Cell";
    char buf[64];
    sprintf(buf, "Level_%d", level);
    std::string sLevel = buf;
    //
    // Now for the full pathname of that directory.
    //
    std::string FullPath = dir;
    if ( ! FullPath.empty() && FullPath[FullPath.size()-1] != '/')
    {
        FullPath += '/';
    }
    FullPath += sLevel;
    //
    // Only the I/O processor makes the directory if it doesn't already exist.
    //
    if ( ! levelDirectoryCreated) {
        if (ParallelDescriptor::IOProcessor()) {
            if ( ! amrex::UtilCreateDirectory(FullPath, 0755)) {
                amrex::CreateDirectoryFailed(FullPath);
            }
        }
        // Force other processors to wait until directory is built.
        ParallelDescriptor::Barrier();
    }

    if (ParallelDescriptor::IOProcessor())
    {
        os << level << ' ' << grids.size() << ' ' << cur_time << '\n';
        os << parent->levelSteps(level) << '\n';

        for (i = 0; i < grids.size(); ++i)
        {
            RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());
            for (n = 0; n < AMREX_SPACEDIM; n++)
                os << gridloc.lo(n) << ' ' << gridloc.hi(n) << '\n';
        }
        //
        // The full relative pathname of the MultiFabs at this level.
        // The name is relative to the Header file containing this name.
        // It's the name that gets written into the Header.
        //
        if (n_data_items > 0)
        {
            std::string PathNameInHeader = sLevel;
            PathNameInHeader += BaseName;
            os << PathNameInHeader << '\n';
        }

#ifdef AMREX_USE_EB
        if (EB2::TopIndexSpaceIfPresent()) {
            // volfrac threshold for amrvis
            if (level == parent->finestLevel()) {
                for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
                    os << "1.0e-6\n";
                }
            }
        }
#endif
    }
    //
    // We combine all of the multifabs -- state, derived, etc -- into one
    // multifab -- plotMF.
    int       cnt   = 0;
    const int nGrow = 0;
    MultiFab  plotMF(grids,dmap,n_data_items,nGrow,MFInfo(),Factory());
    MultiFab* this_dat = 0;
    //
    // Cull data from state variables -- use no ghost cells.
    //
    for (i = 0; i < static_cast<int>(plot_var_map.size()); i++)
    {
        int typ  = plot_var_map[i].first;
        int comp = plot_var_map[i].second;
        this_dat = &state[typ].newData();
        MultiFab::Copy(plotMF,*this_dat,comp,cnt,1,nGrow);
        cnt++;
    }

    // derived
    if (derive_names.size() > 0)
    {
        for (auto const& dname : derive_names)
        {
            derive(dname, cur_time, plotMF, cnt);
            cnt += derive_lst.get(dname)->numDerive();
        }
    }

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        plotMF.setVal(0.0, cnt, 1, nGrow);
        auto factory = static_cast<EBFArrayBoxFactory*>(m_factory.get());
        MultiFab::Copy(plotMF,factory->getVolFrac(),0,cnt,1,nGrow);
    }
#endif

    //
    // Use the Full pathname when naming the MultiFab.
    //
    std::string TheFullPath = FullPath;
    TheFullPath += BaseName;
    if (AsyncOut::UseAsyncOut()) {
        VisMF::AsyncWrite(plotMF,TheFullPath);
    } else {
        VisMF::Write(plotMF,TheFullPath,how,true);
    }

    levelDirectoryCreated = false;  // ---- now that the plotfile is finished
}